

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

PositionalBase * __thiscall
args::
PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set,_args::ValueReader>
::GetNextPositional(PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set,_args::ValueReader>
                    *this)

{
  char cVar1;
  int iVar2;
  PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set,_args::ValueReader>
  *pPVar3;
  
  iVar2 = (*(this->super_PositionalBase).super_NamedBase.super_Base._vptr_Base[2])();
  cVar1 = (this->super_PositionalBase).super_NamedBase.field_0x99;
  if (cVar1 == '\x01' && (char)iVar2 == '\0') {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(this->values)._M_h);
  }
  pPVar3 = (PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set,_args::ValueReader>
            *)0x0;
  if (cVar1 != '\0') {
    pPVar3 = this;
  }
  return &pPVar3->super_PositionalBase;
}

Assistant:

virtual PositionalBase *GetNextPositional() override
            {
                const bool wasMatched = Matched();
                auto me = PositionalBase::GetNextPositional();
                if (me && !wasMatched)
                {
                    values.clear();
                }
                return me;
            }